

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

void Acec_VerifyClasses(Gia_Man_t *p,Vec_Wec_t *vLits,Vec_Wec_t *vReprs)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  ulong uVar5;
  Vec_Int_t *p_01;
  Vec_Wrd_t *p_02;
  word wVar6;
  word wVar7;
  int iVar8;
  uint uVar9;
  uint i;
  int iVar10;
  ulong uVar11;
  uint i_00;
  ulong uVar12;
  bool bVar13;
  void **local_88;
  ulong local_68;
  word Truth;
  
  uVar9 = vLits->nSize;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  local_68 = 8;
  if (6 < uVar9 - 1) {
    local_68 = (ulong)uVar9;
  }
  p_00->nSize = 0;
  iVar8 = (int)local_68;
  p_00->nCap = iVar8;
  uVar9 = 0;
  if (iVar8 == 0) {
    local_88 = (void **)0x0;
  }
  else {
    local_88 = (void **)malloc((long)iVar8 << 3);
  }
  p_00->pArray = local_88;
  pVVar3 = Vec_IntAlloc(100);
  pVVar4 = Vec_WrdStart(p->nObjs);
  uVar12 = 0;
  do {
    iVar8 = (int)uVar12;
    uVar5 = uVar12 & 0xffffffff;
    if (vLits->nSize <= iVar8) {
      if (uVar9 != 0) {
        printf("Detected %d oversize support nodes.\n",(ulong)uVar9);
      }
      Vec_IntFree(pVVar3);
      Vec_WrdFree(pVVar4);
      uVar11 = 0;
      iVar8 = 0;
      while( true ) {
        if ((long)vReprs->nSize <= (long)uVar11) {
          if (iVar8 != 0) {
            printf("Total errors in equivalence classes = %d.\n");
          }
          while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
            if ((Vec_Ptr_t *)*local_88 != (Vec_Ptr_t *)0x0) {
              Vec_PtrFree((Vec_Ptr_t *)*local_88);
            }
            local_88 = local_88 + 1;
          }
          Vec_PtrFree(p_00);
          return;
        }
        pVVar3 = Vec_WecEntry(vReprs,(int)uVar11);
        if (uVar5 <= uVar11) break;
        pVVar4 = (Vec_Wrd_t *)local_88[uVar11];
        iVar10 = pVVar3->nSize;
        uVar9 = 0;
        while (i = uVar9, (int)i < iVar10) {
          uVar2 = Vec_IntEntry(pVVar3,i);
          i_00 = i + 1;
          while( true ) {
            iVar10 = pVVar3->nSize;
            uVar9 = i + 1;
            if (iVar10 <= (int)i_00) break;
            uVar9 = Vec_IntEntry(pVVar3,i_00);
            wVar6 = Vec_WrdEntry(pVVar4,i);
            wVar7 = Vec_WrdEntry(pVVar4,i_00);
            if ((((uVar2 == uVar9) && (iVar8 = iVar8 + 1, wVar7 != 0x1234567812345678)) &&
                (wVar6 != 0x1234567812345678)) && (wVar6 != wVar7)) {
              printf("Rank %d:  Lit %d and %d do not pass verification.\n",uVar11,(ulong)i,
                     (ulong)i_00);
            }
            if ((int)uVar9 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            if (((uVar9 ^ uVar2) == 1) &&
               (iVar8 = iVar8 + 1,
               (wVar7 != 0x1234567812345678 && wVar6 != 0x1234567812345678) &&
               (wVar7 ^ wVar6) != 0xffffffffffffffff)) {
              printf("Rank %d:  Lit %d and %d do not pass verification.\n",uVar11,(ulong)i,
                     (ulong)i_00);
            }
            i_00 = i_00 + 1;
          }
        }
        uVar11 = uVar11 + 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    p_01 = Vec_WecEntry(vLits,iVar8);
    p_02 = Vec_WrdAlloc(p_01->nSize);
    for (iVar10 = 0; iVar10 < p_01->nSize; iVar10 = iVar10 + 1) {
      iVar1 = Vec_IntEntry(p_01,iVar10);
      Truth = Gia_ObjComputeTruth6Cis(p,iVar1,pVVar3,pVVar4);
      if (pVVar3->nSize < 7) {
        iVar1 = Abc_Tt6MinBase(&Truth,pVVar3->pArray,pVVar3->nSize);
        pVVar3->nSize = iVar1;
        wVar6 = Truth;
        if (5 < iVar1) goto LAB_0053136f;
      }
      else {
LAB_0053136f:
        uVar9 = uVar9 + 1;
        wVar6 = 0x1234567812345678;
      }
      Vec_WrdPush(p_02,wVar6);
    }
    iVar10 = (int)local_68;
    if (iVar8 == iVar10) {
      uVar11 = (ulong)(uint)(iVar10 * 2);
      if (iVar10 < 0x10) {
        uVar11 = 0x10;
      }
      if (iVar10 < (int)uVar11) {
        if (local_88 == (void **)0x0) {
          local_88 = (void **)malloc(uVar11 << 3);
        }
        else {
          local_88 = (void **)realloc(local_88,uVar11 << 3);
        }
        p_00->pArray = local_88;
        p_00->nCap = (int)uVar11;
        local_68 = uVar11;
      }
    }
    uVar12 = uVar12 + 1;
    p_00->nSize = (int)uVar12;
    local_88[uVar5] = p_02;
  } while( true );
}

Assistant:

void Acec_VerifyClasses( Gia_Man_t * p, Vec_Wec_t * vLits, Vec_Wec_t * vReprs )
{
    Vec_Ptr_t * vFunc = Vec_PtrAlloc( Vec_WecSize(vLits) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, j, k, Entry, Entry2, nOvers = 0, nErrors = 0;
    Vec_WecForEachLevel( vLits, vLevel, i )
    {
        Vec_Wrd_t * vTruths = Vec_WrdAlloc( Vec_IntSize(vLevel) );
        Vec_IntForEachEntry( vLevel, Entry, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, Entry, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) > 6  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
            if ( Vec_IntSize(vSupp) > 5  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            Vec_WrdPush( vTruths, Truth );
        }
        Vec_PtrPush( vFunc, vTruths );
    }
    if ( nOvers )
        printf( "Detected %d oversize support nodes.\n", nOvers );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    // verify the classes
    Vec_WecForEachLevel( vReprs, vLevel, i )
    {
        Vec_Wrd_t * vTruths = (Vec_Wrd_t *)Vec_PtrEntry( vFunc, i );
        Vec_IntForEachEntry( vLevel, Entry, k )
        Vec_IntForEachEntryStart( vLevel, Entry2, j, k+1 )
        {
            word Truth = Vec_WrdEntry( vTruths, k );
            word Truth2 = Vec_WrdEntry( vTruths, j );
            if ( Entry == Entry2 )
            {
                nErrors++;
                if ( Truth != Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
            if ( Entry == Abc_LitNot(Entry2) )
            {
                nErrors++;
                if ( Truth != ~Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
        }
    }
    if ( nErrors )
        printf( "Total errors in equivalence classes = %d.\n", nErrors );
    Vec_VecFree( (Vec_Vec_t *)vFunc );
}